

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect.cpp
# Opt level: O1

EffectStateFactory * getFactoryByType(ALenum type)

{
  int *piVar1;
  EffectStateFactory *pEVar2;
  ulong uVar3;
  
  uVar3 = 5;
  piVar1 = &DAT_001add70;
  do {
    if (piVar1[-8] == type) {
      piVar1 = piVar1 + -8;
      goto LAB_0011e5a4;
    }
    if (piVar1[-4] == type) {
      piVar1 = piVar1 + -4;
      goto LAB_0011e5a4;
    }
    if (*piVar1 == type) goto LAB_0011e5a4;
    if (piVar1[4] == type) {
      piVar1 = piVar1 + 4;
      goto LAB_0011e5a4;
    }
    uVar3 = uVar3 - 1;
    piVar1 = piVar1 + 0x10;
  } while (1 < uVar3);
  piVar1 = (int *)(&UNK_001ade50 + (ulong)(type != 0xa000) * 0x10);
LAB_0011e5a4:
  if (piVar1 != (int *)&std::thread::
                        _State_impl<std::thread::_Invoker<std::tuple<int(*)(ALCcontext*),ALCcontext*>>>
                        ::vtable) {
    pEVar2 = (EffectStateFactory *)(**(code **)(piVar1 + 2))();
    return pEVar2;
  }
  return (EffectStateFactory *)0x0;
}

Assistant:

EffectStateFactory *getFactoryByType(ALenum type)
{
    auto iter = std::find_if(std::begin(FactoryList), std::end(FactoryList),
        [type](const FactoryItem &item) noexcept -> bool
        { return item.Type == type; }
    );
    return (iter != std::end(FactoryList)) ? iter->GetFactory() : nullptr;
}